

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

void client_set_window_input_focus(natwm_state *state,xcb_window_t window)

{
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar1;
  uint32_t values [1];
  
  uVar1 = 0x106387;
  ewmh_update_active_window(state,window);
  xcb_set_input_focus(state->xcb,1,window,0,in_R8,in_R9,uVar1);
  xcb_configure_window(state->xcb,window,0x40);
  xcb_flush(state->xcb);
  return;
}

Assistant:

void client_set_window_input_focus(const struct natwm_state *state, xcb_window_t window)
{
        ewmh_update_active_window(state, window);

        xcb_set_input_focus(
                state->xcb, XCB_INPUT_FOCUS_POINTER_ROOT, window, XCB_TIME_CURRENT_TIME);

        update_stack_mode(state, window, XCB_STACK_MODE_ABOVE);
}